

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O3

void highwayhash::Cpuid(uint32_t level,uint32_t count,uint32_t *abcd)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  if (level == 0) {
    puVar1 = (uint32_t *)cpuid_basic_info(0);
  }
  else if (level == 1) {
    puVar1 = (uint32_t *)cpuid_Version_info(1);
  }
  else if (level == 2) {
    puVar1 = (uint32_t *)cpuid_cache_tlb_info(2);
  }
  else if (level == 3) {
    puVar1 = (uint32_t *)cpuid_serial_info(3);
  }
  else if (level == 4) {
    puVar1 = (uint32_t *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (level == 5) {
    puVar1 = (uint32_t *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (level == 6) {
    puVar1 = (uint32_t *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (level == 7) {
    puVar1 = (uint32_t *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (level == 9) {
    puVar1 = (uint32_t *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (level == 10) {
    puVar1 = (uint32_t *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (level == 0xb) {
    puVar1 = (uint32_t *)cpuid_Extended_Topology_info(0xb);
  }
  else if (level == 0xd) {
    puVar1 = (uint32_t *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (level == 0xf) {
    puVar1 = (uint32_t *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (level == 0x80000002) {
    puVar1 = (uint32_t *)cpuid_brand_part1_info(0x80000002);
  }
  else if (level == 0x80000003) {
    puVar1 = (uint32_t *)cpuid_brand_part2_info(0x80000003);
  }
  else if (level == 0x80000004) {
    puVar1 = (uint32_t *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar1 = (uint32_t *)cpuid(level);
  }
  uVar2 = puVar1[1];
  uVar3 = puVar1[2];
  uVar4 = puVar1[3];
  *abcd = *puVar1;
  abcd[1] = uVar2;
  abcd[2] = uVar4;
  abcd[3] = uVar3;
  return;
}

Assistant:

void Cpuid(const uint32_t level, const uint32_t count,
           uint32_t* HH_RESTRICT abcd) {
#if HH_MSC_VERSION
  int regs[4];
  __cpuidex(regs, level, count);
  for (int i = 0; i < 4; ++i) {
    abcd[i] = regs[i];
  }
#else
  uint32_t a, b, c, d;
  __cpuid_count(level, count, a, b, c, d);
  abcd[0] = a;
  abcd[1] = b;
  abcd[2] = c;
  abcd[3] = d;
#endif
}